

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall backend::codegen::RegAllocator::invalidate_read(RegAllocator *this,int pos)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  pointer ppVar4;
  reference ppVar5;
  Function *function;
  Function *this_00;
  ostream *poVar6;
  uint in_ESI;
  pair<unsigned_int,_unsigned_int> r;
  iterator ait;
  iterator it;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *in_stack_fffffffffffffbc8;
  Function *in_stack_fffffffffffffbd0;
  Function *this_01;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
  in_stack_fffffffffffffbd8;
  string *name;
  Function *in_stack_fffffffffffffbe0;
  Function *in_stack_fffffffffffffbf8;
  ostream *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  Timestamp *in_stack_fffffffffffffc58;
  Timestamp *timestamp;
  ostream *in_stack_fffffffffffffc60;
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [8];
  Severity *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  time_point_sys_clock local_2c8;
  Timestamp local_2c0 [3];
  undefined1 local_271;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_270;
  __node_type *local_268;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_260;
  undefined1 local_251 [40];
  allocator<char> local_229;
  string local_228 [120];
  time_point_sys_clock local_1b0;
  Timestamp local_1a8 [3];
  undefined1 local_159;
  _List_node_base *local_158;
  _List_node_base *local_150;
  _List_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_148;
  pair<unsigned_int,_unsigned_int> local_140;
  _Self local_138;
  _Self local_130;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_128;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_120;
  undefined1 local_111 [40];
  ostream local_e9;
  string local_e8 [120];
  time_point_sys_clock local_70;
  Timestamp local_68 [3];
  undefined1 local_d;
  uint local_c;
  
  local_d = 1;
  local_c = in_ESI;
  AixLog::operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  AixLog::Tag::Tag((Tag *)0x245bef);
  AixLog::operator<<(in_stack_fffffffffffffc00,(Tag *)in_stack_fffffffffffffbf8);
  local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_68,&local_70);
  AixLog::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  poVar6 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
             (allocator<char> *)in_stack_fffffffffffffc00);
  timestamp = (Timestamp *)local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
             (allocator<char> *)in_stack_fffffffffffffc00);
  AixLog::Function::Function
            (in_stack_fffffffffffffbe0,(string *)in_stack_fffffffffffffbd8._M_cur,
             (string *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
  poVar3 = AixLog::operator<<(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  std::operator<<(poVar3,"Invalidating: ");
  AixLog::Function::~Function(in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string((string *)(local_111 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  AixLog::Timestamp::~Timestamp(local_68);
  AixLog::Tag::~Tag((Tag *)0x245d6b);
  local_120._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::begin(in_stack_fffffffffffffbc8);
  do {
    while( true ) {
      local_128._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
           ::end(in_stack_fffffffffffffbc8);
      bVar2 = std::__detail::operator!=(&local_120,&local_128);
      if (!bVar2) {
        local_271 = 1;
        AixLog::operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        AixLog::Tag::Tag((Tag *)0x2462ef);
        function = (Function *)
                   AixLog::operator<<(in_stack_fffffffffffffc00,(Tag *)in_stack_fffffffffffffbf8);
        local_2c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_2c0,&local_2c8);
        this_00 = (Function *)AixLog::operator<<(poVar6,timestamp);
        name = (string *)&local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                   (allocator<char> *)in_stack_fffffffffffffc00);
        this_01 = (Function *)&local_369;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                   (allocator<char> *)in_stack_fffffffffffffc00);
        AixLog::Function::Function(this_00,name,(string *)this_01,(size_t)in_stack_fffffffffffffbc8)
        ;
        poVar6 = AixLog::operator<<(in_stack_fffffffffffffc00,function);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        AixLog::Function::~Function(this_01);
        std::__cxx11::string::~string(local_368);
        std::allocator<char>::~allocator(&local_369);
        std::__cxx11::string::~string(local_340);
        std::allocator<char>::~allocator(&local_341);
        AixLog::Timestamp::~Timestamp(local_2c0);
        AixLog::Tag::~Tag((Tag *)0x246445);
        return;
      }
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                             *)0x245dce);
      if ((ppVar4->second).end <= local_c) break;
      local_270._M_cur =
           (__node_type *)
           std::__detail::
           _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>::
           operator++((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                       *)in_stack_fffffffffffffbc8,0);
    }
    local_130._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)in_stack_fffffffffffffbc8);
    while( true ) {
      local_138._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)in_stack_fffffffffffffbc8);
      bVar2 = std::operator!=(&local_130,&local_138);
      if (!bVar2) break;
      ppVar5 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                         ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x245e41);
      local_140 = *ppVar5;
      uVar1 = local_140.second;
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                             *)0x245e67);
      if (uVar1 == ppVar4->first) {
        std::_List_const_iterator<std::pair<unsigned_int,_unsigned_int>_>::_List_const_iterator
                  (&local_148,&local_130);
        local_150 = (_List_node_base *)
                    std::__cxx11::
                    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::erase((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)in_stack_fffffffffffffbd0,
                            (const_iterator)in_stack_fffffffffffffbd8._M_cur);
        break;
      }
      local_158 = (_List_node_base *)
                  std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++
                            (&local_130,0);
    }
    local_159 = 1;
    AixLog::operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    AixLog::Tag::Tag((Tag *)0x245ff7);
    AixLog::operator<<(in_stack_fffffffffffffc00,(Tag *)in_stack_fffffffffffffbf8);
    local_1b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_1a8,&local_1b0);
    AixLog::operator<<(poVar6,timestamp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_251;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    AixLog::Function::Function
              (in_stack_fffffffffffffbe0,(string *)in_stack_fffffffffffffbd8._M_cur,
               (string *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
    in_stack_fffffffffffffc08 =
         AixLog::operator<<(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                           *)0x2460ee);
    in_stack_fffffffffffffc00 =
         (ostream *)std::ostream::operator<<(in_stack_fffffffffffffc08,ppVar4->first);
    std::operator<<(in_stack_fffffffffffffc00," ");
    AixLog::Function::~Function(in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string((string *)(local_251 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_251);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator(&local_229);
    AixLog::Timestamp::~Timestamp(local_1a8);
    AixLog::Tag::~Tag((Tag *)0x24616f);
    local_268 = local_120._M_cur;
    local_260._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
         ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                  *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8._M_cur);
    local_120._M_cur = local_260._M_cur;
  } while( true );
}

Assistant:

void invalidate_read(int pos) {
    LOG(DEBUG) << "Invalidating: ";
    auto it = active.begin();
    while (it != active.end()) {
      if (it->second.end <= pos) {
        // The register is no longer to be read from, thus is freed
        auto ait = active_reg_map.begin();
        while (ait != active_reg_map.end()) {
          auto r = *ait;
          if (r.second == it->first) {
            active_reg_map.erase(ait);
            break;
          } else {
            ait++;
          }
        }
        LOG(DEBUG) << it->first << " ";
        it = active.erase(it);
      } else {
        it++;
      }
    }
    LOG(DEBUG) << std::endl;
  }